

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O2

void __thiscall embree::SubdivMesh::updateBuffer(SubdivMesh *this,RTCBufferType type,uint slot)

{
  uint *puVar1;
  bool *pbVar2;
  undefined8 *puVar3;
  RawBufferView *pRVar4;
  allocator local_39;
  string local_38 [32];
  
  if (type == RTC_BUFFER_TYPE_LEVEL) {
    if (slot != 0) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
      *puVar3 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar3 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar3 + 2),local_38);
      __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    puVar1 = &(this->levels).super_RawBufferView.modCounter;
    *puVar1 = *puVar1 + 1;
    pbVar2 = &(this->levels).super_RawBufferView.modified;
  }
  else {
    this->commitCounter = this->commitCounter + 1;
    switch(type) {
    case RTC_BUFFER_TYPE_FACE:
      if (slot != 0) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
        *puVar3 = &PTR__rtcore_error_021d38e0;
        *(undefined4 *)(puVar3 + 1) = 2;
        std::__cxx11::string::string((string *)(puVar3 + 2),local_38);
        __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      puVar1 = &(this->faceVertices).super_RawBufferView.modCounter;
      *puVar1 = *puVar1 + 1;
      pbVar2 = &(this->faceVertices).super_RawBufferView.modified;
      break;
    case RTC_BUFFER_TYPE_LEVEL:
switchD_005ad53a_caseD_11:
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_38,"unknown buffer type",&local_39);
      *puVar3 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar3 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar3 + 2),local_38);
      __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    case RTC_BUFFER_TYPE_EDGE_CREASE_INDEX:
      if (slot != 0) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
        *puVar3 = &PTR__rtcore_error_021d38e0;
        *(undefined4 *)(puVar3 + 1) = 2;
        std::__cxx11::string::string((string *)(puVar3 + 2),local_38);
        __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      puVar1 = &(this->edge_creases).super_RawBufferView.modCounter;
      *puVar1 = *puVar1 + 1;
      pbVar2 = &(this->edge_creases).super_RawBufferView.modified;
      break;
    case RTC_BUFFER_TYPE_EDGE_CREASE_WEIGHT:
      if (slot != 0) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
        *puVar3 = &PTR__rtcore_error_021d38e0;
        *(undefined4 *)(puVar3 + 1) = 2;
        std::__cxx11::string::string((string *)(puVar3 + 2),local_38);
        __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      puVar1 = &(this->edge_crease_weights).super_RawBufferView.modCounter;
      *puVar1 = *puVar1 + 1;
      pbVar2 = &(this->edge_crease_weights).super_RawBufferView.modified;
      break;
    case RTC_BUFFER_TYPE_VERTEX_CREASE_INDEX:
      if (slot != 0) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
        *puVar3 = &PTR__rtcore_error_021d38e0;
        *(undefined4 *)(puVar3 + 1) = 2;
        std::__cxx11::string::string((string *)(puVar3 + 2),local_38);
        __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      puVar1 = &(this->vertex_creases).super_RawBufferView.modCounter;
      *puVar1 = *puVar1 + 1;
      pbVar2 = &(this->vertex_creases).super_RawBufferView.modified;
      break;
    case RTC_BUFFER_TYPE_VERTEX_CREASE_WEIGHT:
      if (slot != 0) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
        *puVar3 = &PTR__rtcore_error_021d38e0;
        *(undefined4 *)(puVar3 + 1) = 2;
        std::__cxx11::string::string((string *)(puVar3 + 2),local_38);
        __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      puVar1 = &(this->vertex_crease_weights).super_RawBufferView.modCounter;
      *puVar1 = *puVar1 + 1;
      pbVar2 = &(this->vertex_crease_weights).super_RawBufferView.modified;
      break;
    case RTC_BUFFER_TYPE_HOLE:
      if (slot != 0) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
        *puVar3 = &PTR__rtcore_error_021d38e0;
        *(undefined4 *)(puVar3 + 1) = 2;
        std::__cxx11::string::string((string *)(puVar3 + 2),local_38);
        __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      puVar1 = &(this->holes).super_RawBufferView.modCounter;
      *puVar1 = *puVar1 + 1;
      pbVar2 = &(this->holes).super_RawBufferView.modified;
      break;
    default:
      if (type == RTC_BUFFER_TYPE_INDEX) {
        if ((this->topology).size_active <= (ulong)slot) {
          puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
          *puVar3 = &PTR__rtcore_error_021d38e0;
          *(undefined4 *)(puVar3 + 1) = 2;
          std::__cxx11::string::string((string *)(puVar3 + 2),local_38);
          __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
        }
        pRVar4 = &(this->topology).items[slot].vertexIndices.super_RawBufferView;
      }
      else {
        if (type == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
          if ((this->vertexAttribs).size_active <= (ulong)slot) {
            puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
            *puVar3 = &PTR__rtcore_error_021d38e0;
            *(undefined4 *)(puVar3 + 1) = 2;
            std::__cxx11::string::string((string *)(puVar3 + 2),local_38);
            __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
          }
          pRVar4 = (this->vertexAttribs).items;
        }
        else {
          if (type != RTC_BUFFER_TYPE_VERTEX) goto switchD_005ad53a_caseD_11;
          if ((this->vertices).size_active <= (ulong)slot) {
            puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
            *puVar3 = &PTR__rtcore_error_021d38e0;
            *(undefined4 *)(puVar3 + 1) = 2;
            std::__cxx11::string::string((string *)(puVar3 + 2),local_38);
            __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
          }
          pRVar4 = &((this->vertices).items)->super_RawBufferView;
        }
        pRVar4 = pRVar4 + slot;
      }
      pbVar2 = &pRVar4->modified;
      *(uint *)(pbVar2 + -4) = *(uint *)(pbVar2 + -4) + 1;
    }
  }
  *pbVar2 = true;
  Geometry::update(&this->super_Geometry);
  return;
}

Assistant:

void SubdivMesh::updateBuffer(RTCBufferType type, unsigned int slot)
  {
    if (type != RTC_BUFFER_TYPE_LEVEL)
      commitCounter++;

    if (type == RTC_BUFFER_TYPE_VERTEX)
    {
      if (slot >= vertices.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      vertices[slot].setModified();
    }
    else if (type == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE)
    {
      if (slot >= vertexAttribs.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      vertexAttribs[slot].setModified();
    }
    else if (type == RTC_BUFFER_TYPE_FACE)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      faceVertices.setModified();
    }
    else if (type == RTC_BUFFER_TYPE_INDEX)
    {
      if (slot >= topology.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      topology[slot].vertexIndices.setModified();
    }
    else if (type == RTC_BUFFER_TYPE_EDGE_CREASE_INDEX)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      edge_creases.setModified();
    }
    else if (type == RTC_BUFFER_TYPE_EDGE_CREASE_WEIGHT)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      edge_crease_weights.setModified();
    }
    else if (type == RTC_BUFFER_TYPE_VERTEX_CREASE_INDEX)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      vertex_creases.setModified();
    }
    else if (type == RTC_BUFFER_TYPE_VERTEX_CREASE_WEIGHT)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      vertex_crease_weights.setModified();
    }
    else if (type == RTC_BUFFER_TYPE_HOLE)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      holes.setModified();
    }
    else if (type == RTC_BUFFER_TYPE_LEVEL)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      levels.setModified();
    }
    else
    {
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "unknown buffer type");
    }

    Geometry::update();
  }